

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O0

void __thiscall
TRM::TinyRender::triangle(TinyRender *this,Vec2i *a,Vec2i *b,Vec2i *c,TGAColor *color)

{
  TGAImage *this_00;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *__b;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 *paVar6;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 *paVar7;
  float *pfVar8;
  Vec3f VVar9;
  vec<3,_float,_(glm::qualifier)0> local_b0;
  vec<2,_float,_(glm::qualifier)0> local_a0;
  vec<2,_float,_(glm::qualifier)0> local_98;
  vec<2,_float,_(glm::qualifier)0> local_90;
  vec<2,_float,_(glm::qualifier)0> local_88;
  undefined1 local_80 [8];
  Vec3f bc_screen;
  Vec2i p;
  int local_64;
  int j;
  int i;
  Vec2i clamp;
  Vec2i bboxmax;
  Vec2i bboxmin;
  Vec2i pts [3];
  TGAColor *color_local;
  Vec2i *c_local;
  Vec2i *b_local;
  Vec2i *a_local;
  TinyRender *this_local;
  
  iVar2 = TGAImage::get_width(*(TGAImage **)(this + 8));
  iVar3 = TGAImage::get_height(*(TGAImage **)(this + 8));
  glm::vec<2,_int,_(glm::qualifier)0>::vec(&bboxmax,iVar2 + -1,iVar3 + -1);
  memset(&clamp,0,8);
  iVar2 = TGAImage::get_width(*(TGAImage **)(this + 8));
  iVar3 = TGAImage::get_height(*(TGAImage **)(this + 8));
  glm::vec<2,_int,_(glm::qualifier)0>::vec
            ((vec<2,_int,_(glm::qualifier)0> *)&j,iVar2 + -1,iVar3 + -1);
  for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
    for (p.field_1.y = 0; p.field_1.y < 2; p.field_1.y = p.field_1.y + 1) {
      p.field_0.x = 0;
      piVar4 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](&bboxmax,p.field_1.y);
      piVar5 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         (pts + (long)local_64 + -1,p.field_1.y);
      piVar4 = std::min<int>(piVar4,piVar5);
      piVar4 = std::max<int>((int *)&p,piVar4);
      iVar2 = *piVar4;
      piVar4 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](&bboxmax,p.field_1.y);
      *piVar4 = iVar2;
      piVar4 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&j,p.field_1.y);
      piVar5 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](&clamp,p.field_1.y);
      __b = glm::vec<2,_int,_(glm::qualifier)0>::operator[](pts + (long)local_64 + -1,p.field_1.y);
      piVar5 = std::max<int>(piVar5,__b);
      piVar4 = std::min<int>(piVar4,piVar5);
      iVar2 = *piVar4;
      piVar4 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](&clamp,p.field_1.y);
      *piVar4 = iVar2;
    }
  }
  paVar6 = (anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 *)
           glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                     ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,0);
  *paVar6 = bboxmax.field_0;
  while (piVar4 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                            ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,0),
        aVar1 = bboxmax.field_1, *piVar4 <= clamp.field_0.x) {
    paVar7 = (anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 *)
             glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,1);
    *paVar7 = aVar1;
    while (piVar4 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                              ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,1),
          *piVar4 <= clamp.field_1.y) {
      glm::vec<2,float,(glm::qualifier)0>::vec<int,(glm::qualifier)0>
                ((vec<2,float,(glm::qualifier)0> *)&local_88,a);
      glm::vec<2,float,(glm::qualifier)0>::vec<int,(glm::qualifier)0>
                ((vec<2,float,(glm::qualifier)0> *)&local_90,b);
      glm::vec<2,float,(glm::qualifier)0>::vec<int,(glm::qualifier)0>
                ((vec<2,float,(glm::qualifier)0> *)&local_98,c);
      glm::vec<2,float,(glm::qualifier)0>::vec<int,(glm::qualifier)0>
                ((vec<2,float,(glm::qualifier)0> *)&local_a0,
                 (vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1);
      VVar9 = barycentric<2ul>(local_88,local_90,local_98,local_a0);
      local_b0._0_8_ = VVar9._0_8_;
      local_80._0_4_ = local_b0.field_0;
      local_80._4_4_ = local_b0.field_1;
      local_b0.field_2 = VVar9.field_2;
      bc_screen.field_0.x = local_b0.field_2.z;
      pfVar8 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_80,0);
      if (((0.0 < *pfVar8 || *pfVar8 == 0.0) &&
          (pfVar8 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_80,1),
          0.0 < *pfVar8 || *pfVar8 == 0.0)) &&
         (pfVar8 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                             ((vec<3,_float,_(glm::qualifier)0> *)local_80,2),
         0.0 < *pfVar8 || *pfVar8 == 0.0)) {
        this_00 = *(TGAImage **)(this + 8);
        piVar4 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                           ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,0);
        iVar2 = *piVar4;
        piVar4 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                           ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,1);
        TGAImage::set(this_00,iVar2,*piVar4,color);
      }
      piVar4 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,1);
      *piVar4 = *piVar4 + 1;
    }
    piVar4 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,0);
    *piVar4 = *piVar4 + 1;
  }
  return;
}

Assistant:

void TinyRender::triangle(const Vec2i& a, const Vec2i& b, const Vec2i& c,
                          const TGAColor& color) {
  Vec2i pts[] = {a, b, c};

  Vec2i bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2i bboxmax(0, 0);
  Vec2i clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  Vec2i p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<2>(a, b, c, p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      mImage->set(p[0], p[1], color);
    }
  }
}